

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall CfgNode::BlockData::clearInstructions(BlockData *this)

{
  list<Instruction_*,_std::allocator<Instruction_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  plVar1 = &this->m_instrs;
  p_Var3 = (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
  _M_size = 0;
  this->m_size = 0;
  return;
}

Assistant:

void CfgNode::BlockData::clearInstructions() {
	m_instrs.clear();
	m_size = 0;
}